

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O1

shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
 __thiscall
peg::ParserGenerator::perform_core
          (ParserGenerator *this,char *s,size_t n,Rules *rules,string *start,
          bool *enablePackratParsing,Log *log)

{
  byte bVar1;
  element_type *peVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Manager_type p_Var6;
  Log log_00;
  int iVar7;
  mapped_type *pmVar8;
  long *plVar9;
  mapped_type *pmVar10;
  const_iterator cVar11;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var12;
  const_iterator cVar13;
  mapped_type *rule;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
  *__x;
  uint uVar14;
  ulong uVar15;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var16;
  ulong uVar17;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var18;
  string *psVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var20;
  pointer ppVar21;
  __node_base *p_Var22;
  __node_base _Var23;
  char *__end;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var24;
  ulong uVar25;
  ulong uVar26;
  _Hash_node_base *p_Var27;
  _Hash_node_base *p_Var28;
  long *plVar29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  long lVar31;
  undefined8 uVar32;
  long lVar33;
  undefined4 uVar34;
  undefined8 uVar35;
  _Manager_type p_Var36;
  bool bVar37;
  shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
  sVar38;
  shared_ptr<peg::Ope> ope;
  ReferenceChecker vis;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  referenced;
  Result r;
  Data data;
  Result *__args_4;
  _Alloc_hider _Var39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_388;
  element_type *local_380;
  string *local_378;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_370;
  undefined1 local_368 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  _Hash_node_base _Stack_348;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_340;
  undefined1 local_338 [16];
  undefined1 local_328 [32];
  shared_ptr<peg::Ope> local_308;
  __node_base _Stack_2f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2f0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_2b8;
  string *local_2b0;
  undefined1 local_2a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298 [2];
  long *local_270 [2];
  long local_260 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  mapped_type *local_230;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_228;
  any local_220;
  string *local_210;
  long local_208;
  ulong local_200;
  _Any_data local_1f8;
  code *local_1e8;
  Result local_1d8;
  _Any_data local_150;
  code *local_140;
  undefined1 local_130 [128];
  mapped_type *local_b0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  local_98;
  vector<std::set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  local_80;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_68;
  bool local_38;
  
  local_388 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)n;
  local_380 = &this->g;
  local_228 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)s;
  local_210 = (string *)enablePackratParsing;
  Data::Data((Data *)local_130);
  uVar35 = local_130._0_8_;
  local_368._0_8_ = &local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"%recover","");
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)uVar35,(key_type *)local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._0_8_ != &local_358) {
    operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
  }
  local_368._0_8_ = &local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"x","");
  __args_4 = &local_1d8;
  local_1d8.ret = false;
  local_1d8.recovered = false;
  local_1d8._2_6_ = 0;
  local_1d8.len = 0;
  local_1d8.error_info.error_pos = (char *)0x0;
  local_250._M_dataplus._M_p = "";
  local_220._M_manager =
       (_func_void__Op_any_ptr__Arg_ptr *)((ulong)local_220._M_manager & 0xffffffffffffff00);
  local_2a8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_370 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)uVar35;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<peg::Reference,std::allocator<peg::Reference>,std::unordered_map<std::__cxx11::string,peg::Definition,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,peg::Definition>>>const&,std::__cxx11::string_const&,char_const*&,bool&,std::vector<std::shared_ptr<peg::Ope>,std::allocator<std::shared_ptr<peg::Ope>>>const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2a8 + 8),(Reference **)local_2a8,
             (allocator<peg::Reference> *)local_270,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
              *)uVar35,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
             (char **)&local_250,(bool *)&local_220,
             (vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_> *)
             __args_4);
  std::__shared_ptr<peg::Reference,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<peg::Reference,peg::Reference>
            ((__shared_ptr<peg::Reference,(__gnu_cxx::_Lock_policy)2> *)local_2a8,
             (Reference *)local_2a8._0_8_);
  peVar2 = (pmVar8->holder_).super___shared_ptr<peg::Holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar2->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2a8._0_8_;
  _Var39._M_p = (pointer)local_2a8._0_8_;
  _Var20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar2->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffc60);
  if (_Var20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var20._M_pi);
  }
  std::vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_>::~vector
            ((vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_> *)
             &local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._0_8_ != &local_358) {
    operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
  }
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)(pmVar8->name)._M_string_length,0x150a73)
  ;
  pmVar8->s_ = "[native]";
  pmVar8->ignoreSemanticValue = true;
  pmVar8->is_macro = true;
  local_368._0_8_ = &local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"x","");
  local_378 = (string *)&_Stack_348;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pmVar8->params,
             local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._0_8_ != &local_358) {
    operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
  }
  local_220._M_manager = std::any::_Manager_internal<peg::ParserGenerator::Data_*>::_S_manage;
  local_368._0_8_ = &local_358;
  local_220._M_storage._M_ptr = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"Grammar","");
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_228,(key_type *)local_368);
  std::
  function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_1f8,
             (function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  p_Var12 = local_388;
  log_00.super__Function_base._M_functor._8_8_ = __args_4;
  log_00.super__Function_base._M_functor._M_unused._M_object = &local_1f8;
  log_00.super__Function_base._M_manager = (_Manager_type)_Var39._M_p;
  log_00._M_invoker = (_Invoker_type)_Var20._M_pi;
  Definition::parse(&local_1d8,pmVar8,(char *)local_388,(size_t)rules,&local_220,(char *)0x0,log_00)
  ;
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._0_8_ != &local_358) {
    operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
  }
  if (local_1d8.ret == false) {
    if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope !=
        (_func_int **)0x0) {
      if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)local_1d8.error_info.message_pos ==
          (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)0x0) {
        if (local_1d8.error_info.error_pos < p_Var12 ||
            (long)local_1d8.error_info.error_pos - (long)p_Var12 == 0) {
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          p_Var24 = p_Var12;
        }
        else {
          uVar14 = 1;
          p_Var16 = p_Var12;
          p_Var24 = p_Var12;
          do {
            bVar37 = *(char *)&p_Var24->_M_buckets == '\n';
            p_Var24 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)((long)&p_Var24->_M_buckets + 1);
            if (bVar37) {
              p_Var16 = p_Var24;
            }
            uVar14 = uVar14 + bVar37;
          } while (p_Var24 !=
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_1d8.error_info.error_pos);
          p_Var24 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((long)p_Var12 + ((long)local_1d8.error_info.error_pos - (long)p_Var12));
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ulong)uVar14;
          p_Var12 = p_Var16;
        }
        uVar15 = (long)p_Var24 - (long)p_Var12;
        if (uVar15 != 0) {
          uVar17 = 0;
          do {
            bVar1 = *(byte *)((long)&p_Var12->_M_buckets + uVar17);
            lVar31 = 1;
            if ((((char)bVar1 < '\0') &&
                ((uVar25 = uVar15 - uVar17, uVar25 == 1 || (lVar31 = 2, (bVar1 & 0xe0) != 0xc0))))
               && ((uVar25 < 3 || (lVar31 = 3, (bVar1 & 0xf0) != 0xe0)))) {
              lVar31 = 0;
              if (3 < uVar25) {
                lVar31 = (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
              }
            }
            uVar17 = uVar17 + lVar31;
          } while (uVar17 < uVar15);
        }
        local_368._0_8_ = &local_358;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"syntax error","");
        local_2a8._0_8_ = paVar30;
        if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope ==
            (_func_int **)0x0) {
          std::__throw_bad_function_call();
        }
        (*(code *)ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3]._vptr_Ope)
                  (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,local_2a8,
                   &stack0xfffffffffffffc58,local_368,&local_1d8.error_info.label);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._0_8_ != &local_358) {
          operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
        }
      }
      else {
        local_2a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
        if (local_1d8.error_info.message_pos < p_Var12 ||
            (long)local_1d8.error_info.message_pos - (long)p_Var12 == 0) {
          local_368._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1;
          p_Var24 = p_Var12;
        }
        else {
          uVar14 = 1;
          p_Var16 = p_Var12;
          p_Var24 = p_Var12;
          do {
            bVar37 = *(char *)&p_Var24->_M_buckets == '\n';
            p_Var24 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)((long)&p_Var24->_M_buckets + 1);
            if (bVar37) {
              p_Var16 = p_Var24;
            }
            uVar14 = uVar14 + bVar37;
          } while (p_Var24 !=
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_1d8.error_info.message_pos);
          p_Var24 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((long)p_Var12 + ((long)local_1d8.error_info.message_pos - (long)p_Var12));
          local_368._0_8_ = ZEXT48(uVar14);
          p_Var12 = p_Var16;
        }
        uVar15 = (long)p_Var24 - (long)p_Var12;
        if (uVar15 != 0) {
          local_2a8._0_8_ = 1;
          uVar17 = 0;
          do {
            bVar1 = *(byte *)((long)&p_Var12->_M_buckets + uVar17);
            lVar31 = 1;
            if ((((char)bVar1 < '\0') &&
                ((uVar25 = uVar15 - uVar17, uVar25 == 1 || (lVar31 = 2, (bVar1 & 0xe0) != 0xc0))))
               && ((uVar25 < 3 || (lVar31 = 3, (bVar1 & 0xf0) != 0xe0)))) {
              lVar31 = 0;
              if (3 < uVar25) {
                lVar31 = (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
              }
            }
            uVar17 = uVar17 + lVar31;
            local_2a8._0_8_ = local_2a8._0_8_ + 1;
          } while (uVar17 < uVar15);
        }
        (*(code *)ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3]._vptr_Ope)
                  ();
      }
    }
  }
  else {
    plVar29 = (long *)(start->field_2)._M_allocated_capacity;
    if (plVar29 != (long *)0x0) {
      rules = (Rules *)local_368;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
                *)rules,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
                         *)(plVar29 + 1));
        local_2a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_2a8 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2a8,local_368._0_8_,
                   (char *)(local_368._0_8_ + (long)(__buckets_ptr *)local_368._8_8_));
        if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ ==
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
           (*(_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_2a8._0_8_ !=
            (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
             )0x7e)) {
          bVar37 = false;
        }
        else {
          bVar37 = true;
          std::__cxx11::string::erase((ulong)local_2a8,0);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pmVar8 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_370,(key_type *)local_2a8);
          peVar2 = (pmVar8->holder_).super___shared_ptr<peg::Holder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          (peVar2->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)_Stack_348._M_nxt;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(peVar2->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,&local_340);
          std::__cxx11::string::_M_assign((string *)pmVar8);
          pmVar8->ignoreSemanticValue = bVar37;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_,local_298[0]._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(local_340._M_pi._4_4_,local_340._M_pi._0_4_) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(local_340._M_pi._4_4_,local_340._M_pi._0_4_));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._0_8_ != &local_358) {
          operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
        }
        plVar29 = (long *)*plVar29;
      } while (plVar29 != (long *)0x0);
    }
    if (local_130._56_8_ == local_130._64_8_) {
      uVar35 = CONCAT71((int7)((ulong)rules >> 8),1);
    }
    else {
      ppVar21 = (pointer)local_130._56_8_;
      do {
        if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope !=
            (_func_int **)0x0) {
          p_Var12 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)ppVar21->second;
          plVar29 = (long *)0x1;
          p_Var27 = (_Hash_node_base *)0x1;
          p_Var24 = local_388;
          p_Var16 = local_388;
          if (local_388 <= p_Var12 && (long)p_Var12 - (long)local_388 != 0) {
            uVar14 = 1;
            do {
              bVar37 = *(char *)&p_Var16->_M_buckets == '\n';
              p_Var16 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)((long)&p_Var16->_M_buckets + 1);
              if (bVar37) {
                p_Var24 = p_Var16;
              }
              uVar14 = uVar14 + bVar37;
            } while (p_Var16 != p_Var12);
            p_Var16 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)(((long)p_Var12 - (long)local_388) + (long)local_388);
            p_Var27 = (_Hash_node_base *)(ulong)uVar14;
          }
          uVar15 = (long)p_Var16 - (long)p_Var24;
          if (uVar15 != 0) {
            plVar29 = (long *)0x1;
            uVar17 = 0;
            do {
              bVar1 = *(byte *)((long)&p_Var24->_M_buckets + uVar17);
              lVar31 = 1;
              if ((((char)bVar1 < '\0') &&
                  ((uVar25 = uVar15 - uVar17, uVar25 == 1 || (lVar31 = 2, (bVar1 & 0xe0) != 0xc0))))
                 && ((uVar25 < 3 || (lVar31 = 3, (bVar1 & 0xf0) != 0xe0)))) {
                lVar31 = 0;
                if (3 < uVar25) {
                  lVar31 = (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
                }
              }
              uVar17 = uVar17 + lVar31;
              plVar29 = (long *)((long)plVar29 + 1);
            } while (uVar17 < uVar15);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2a8,"The definition \'",&ppVar21->first);
          plVar9 = (long *)std::__cxx11::string::append((char *)local_2a8);
          local_368._0_8_ = &local_358;
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar30) {
            local_358._M_allocated_capacity = paVar30->_M_allocated_capacity;
            local_358._8_8_ = plVar9[3];
          }
          else {
            local_358._M_allocated_capacity = paVar30->_M_allocated_capacity;
            local_368._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar9;
          }
          local_368._8_8_ = plVar9[1];
          *plVar9 = (long)paVar30;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          _Var39._M_p = (pointer)&local_398;
          std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc58,"");
          local_270[0] = plVar29;
          local_250._M_dataplus._M_p = (pointer)p_Var27;
          if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope ==
              (_func_int **)0x0) {
            std::__throw_bad_function_call();
          }
          (*(code *)ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3]._vptr_Ope
          )(ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_250,local_270
            ,local_368,&stack0xfffffffffffffc58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var39._M_p != &local_398) {
            operator_delete(_Var39._M_p,local_398._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._0_8_ != &local_358) {
            operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_,local_298[0]._M_allocated_capacity + 1);
          }
        }
        ppVar21 = ppVar21 + 1;
      } while (ppVar21 != (pointer)local_130._64_8_);
      uVar35 = 0;
    }
    if (local_130._80_8_ != local_130._88_8_) {
      ppVar21 = (pointer)local_130._80_8_;
      do {
        if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope !=
            (_func_int **)0x0) {
          p_Var12 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)ppVar21->second;
          plVar29 = (long *)0x1;
          p_Var27 = (_Hash_node_base *)0x1;
          p_Var24 = local_388;
          p_Var16 = local_388;
          if (local_388 <= p_Var12 && (long)p_Var12 - (long)local_388 != 0) {
            uVar14 = 1;
            do {
              bVar37 = *(char *)&p_Var16->_M_buckets == '\n';
              p_Var16 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)((long)&p_Var16->_M_buckets + 1);
              if (bVar37) {
                p_Var24 = p_Var16;
              }
              uVar14 = uVar14 + bVar37;
            } while (p_Var16 != p_Var12);
            p_Var16 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)(((long)p_Var12 - (long)local_388) + (long)local_388);
            p_Var27 = (_Hash_node_base *)(ulong)uVar14;
          }
          uVar15 = (long)p_Var16 - (long)p_Var24;
          if (uVar15 != 0) {
            plVar29 = (long *)0x1;
            uVar17 = 0;
            do {
              bVar1 = *(byte *)((long)&p_Var24->_M_buckets + uVar17);
              lVar31 = 1;
              if ((((char)bVar1 < '\0') &&
                  ((uVar25 = uVar15 - uVar17, uVar25 == 1 || (lVar31 = 2, (bVar1 & 0xe0) != 0xc0))))
                 && ((uVar25 < 3 || (lVar31 = 3, (bVar1 & 0xf0) != 0xe0)))) {
                lVar31 = 0;
                if (3 < uVar25) {
                  lVar31 = (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
                }
              }
              uVar17 = uVar17 + lVar31;
              plVar29 = (long *)((long)plVar29 + 1);
            } while (uVar17 < uVar15);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2a8,"The instruction \'",&ppVar21->first);
          plVar9 = (long *)std::__cxx11::string::append((char *)local_2a8);
          local_368._0_8_ = &local_358;
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar30) {
            local_358._M_allocated_capacity = paVar30->_M_allocated_capacity;
            local_358._8_8_ = plVar9[3];
          }
          else {
            local_358._M_allocated_capacity = paVar30->_M_allocated_capacity;
            local_368._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar9;
          }
          local_368._8_8_ = plVar9[1];
          *plVar9 = (long)paVar30;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          _Var39._M_p = (pointer)&local_398;
          std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc58,"");
          local_270[0] = plVar29;
          local_250._M_dataplus._M_p = (pointer)p_Var27;
          if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope ==
              (_func_int **)0x0) {
            std::__throw_bad_function_call();
          }
          (*(code *)ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3]._vptr_Ope
          )(ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_250,local_270
            ,local_368,&stack0xfffffffffffffc58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var39._M_p != &local_398) {
            operator_delete(_Var39._M_p,local_398._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._0_8_ != &local_358) {
            operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_,local_298[0]._M_allocated_capacity + 1);
          }
        }
        ppVar21 = ppVar21 + 1;
      } while (ppVar21 != (pointer)local_130._88_8_);
      uVar35 = 0;
    }
    if (local_98.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_98.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar21 = local_98.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope !=
            (_func_int **)0x0) {
          p_Var12 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)ppVar21->second;
          plVar29 = (long *)0x1;
          p_Var27 = (_Hash_node_base *)0x1;
          p_Var24 = local_388;
          p_Var16 = local_388;
          if (local_388 <= p_Var12 && (long)p_Var12 - (long)local_388 != 0) {
            uVar14 = 1;
            do {
              bVar37 = *(char *)&p_Var16->_M_buckets == '\n';
              p_Var16 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)((long)&p_Var16->_M_buckets + 1);
              if (bVar37) {
                p_Var24 = p_Var16;
              }
              uVar14 = uVar14 + bVar37;
            } while (p_Var16 != p_Var12);
            p_Var16 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)(((long)p_Var12 - (long)local_388) + (long)local_388);
            p_Var27 = (_Hash_node_base *)(ulong)uVar14;
          }
          uVar15 = (long)p_Var16 - (long)p_Var24;
          if (uVar15 != 0) {
            plVar29 = (long *)0x1;
            uVar17 = 0;
            do {
              bVar1 = *(byte *)((long)&p_Var24->_M_buckets + uVar17);
              lVar31 = 1;
              if ((((char)bVar1 < '\0') &&
                  ((uVar25 = uVar15 - uVar17, uVar25 == 1 || (lVar31 = 2, (bVar1 & 0xe0) != 0xc0))))
                 && ((uVar25 < 3 || (lVar31 = 3, (bVar1 & 0xf0) != 0xe0)))) {
                lVar31 = 0;
                if (3 < uVar25) {
                  lVar31 = (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
                }
              }
              uVar17 = uVar17 + lVar31;
              plVar29 = (long *)((long)plVar29 + 1);
            } while (uVar17 < uVar15);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2a8,"The back reference \'",&ppVar21->first);
          plVar9 = (long *)std::__cxx11::string::append((char *)local_2a8);
          local_368._0_8_ = &local_358;
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar30) {
            local_358._M_allocated_capacity = paVar30->_M_allocated_capacity;
            local_358._8_8_ = plVar9[3];
          }
          else {
            local_358._M_allocated_capacity = paVar30->_M_allocated_capacity;
            local_368._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar9;
          }
          local_368._8_8_ = plVar9[1];
          *plVar9 = (long)paVar30;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          _Var39._M_p = (pointer)&local_398;
          std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc58,"");
          local_270[0] = plVar29;
          local_250._M_dataplus._M_p = (pointer)p_Var27;
          if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope ==
              (_func_int **)0x0) {
            std::__throw_bad_function_call();
          }
          (*(code *)ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3]._vptr_Ope
          )(ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_250,local_270
            ,local_368,&stack0xfffffffffffffc58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var39._M_p != &local_398) {
            operator_delete(_Var39._M_p,local_398._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._0_8_ != &local_358) {
            operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_,local_298[0]._M_allocated_capacity + 1);
          }
        }
        ppVar21 = ppVar21 + 1;
      } while (ppVar21 !=
               local_98.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      uVar35 = 0;
    }
    p_Var12 = local_370;
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)local_370,(key_type *)(local_130 + 0x10));
    if (pmVar8->ignoreSemanticValue == true) {
      if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope !=
          (_func_int **)0x0) {
        p_Var24 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)pmVar8->s_;
        plVar29 = (long *)0x1;
        p_Var27 = (_Hash_node_base *)0x1;
        p_Var16 = local_388;
        p_Var18 = local_388;
        if (local_388 <= p_Var24 && (long)p_Var24 - (long)local_388 != 0) {
          uVar14 = 1;
          do {
            bVar37 = *(char *)&p_Var18->_M_buckets == '\n';
            p_Var18 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)((long)&p_Var18->_M_buckets + 1);
            if (bVar37) {
              p_Var16 = p_Var18;
            }
            uVar14 = uVar14 + bVar37;
          } while (p_Var18 != p_Var24);
          p_Var18 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(((long)p_Var24 - (long)local_388) + (long)local_388);
          p_Var27 = (_Hash_node_base *)(ulong)uVar14;
        }
        uVar15 = (long)p_Var18 - (long)p_Var16;
        if (uVar15 != 0) {
          plVar29 = (long *)0x1;
          uVar17 = 0;
          do {
            bVar1 = *(byte *)((long)&p_Var16->_M_buckets + uVar17);
            lVar31 = 1;
            if ((((char)bVar1 < '\0') &&
                ((uVar25 = uVar15 - uVar17, uVar25 == 1 || (lVar31 = 2, (bVar1 & 0xe0) != 0xc0))))
               && ((uVar25 < 3 || (lVar31 = 3, (bVar1 & 0xf0) != 0xe0)))) {
              lVar31 = 0;
              if (3 < uVar25) {
                lVar31 = (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
              }
            }
            uVar17 = uVar17 + lVar31;
            plVar29 = (long *)((long)plVar29 + 1);
          } while (uVar17 < uVar15);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2a8,"Ignore operator cannot be applied to \'",&pmVar8->name);
        plVar9 = (long *)std::__cxx11::string::append(local_2a8);
        paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar30) {
          local_358._M_allocated_capacity = paVar30->_M_allocated_capacity;
          local_358._8_8_ = plVar9[3];
          local_368._0_8_ = &local_358;
        }
        else {
          local_358._M_allocated_capacity = paVar30->_M_allocated_capacity;
          local_368._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar9;
        }
        local_368._8_8_ = plVar9[1];
        *plVar9 = (long)paVar30;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        _Var39._M_p = (pointer)&local_398;
        std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc58,"");
        local_270[0] = plVar29;
        local_250._M_dataplus._M_p = (pointer)p_Var27;
        if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope ==
            (_func_int **)0x0) {
          std::__throw_bad_function_call();
        }
        (*(code *)ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3]._vptr_Ope)
                  (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_250,
                   local_270,local_368,&stack0xfffffffffffffc58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var39._M_p != &local_398) {
          operator_delete(_Var39._M_p,local_398._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._0_8_ != &local_358) {
          operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_,local_298[0]._M_allocated_capacity + 1);
        }
      }
      uVar35 = 0;
    }
    uVar34 = (undefined4)uVar35;
    if ((char)uVar35 != '\0') {
      local_368._0_8_ = &local_358;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"%whitespace","");
      _Stack_348._M_nxt = (_Hash_node_base *)local_338;
      std::__cxx11::string::_M_construct<char_const*>((string *)&_Stack_348,"%word","");
      local_328._0_8_ = local_328 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"%recover","");
      p_Var22 = &_Stack_2f8;
      pcVar3 = (pmVar8->name)._M_dataplus._M_p;
      local_308.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var22;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_308,pcVar3,pcVar3 + (pmVar8->name)._M_string_length);
      local_378 = (string *)&local_308;
      local_230 = pmVar8;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_2a8,local_368,&local_2f0._M_bucket_count,0,&stack0xfffffffffffffc58,
                 &local_250,local_270);
      lVar31 = -0x80;
      do {
        if (p_Var22 != p_Var22[-2]._M_nxt) {
          operator_delete(p_Var22[-2]._M_nxt,(ulong)((long)&p_Var22->_M_nxt->_M_nxt + 1));
        }
        p_Var22 = p_Var22 + -4;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0);
      psVar19 = (string *)(p_Var12->_M_before_begin)._M_nxt;
      if (psVar19 != (string *)0x0) {
        do {
          local_2b0 = psVar19 + 0x118;
          local_368._0_8_ = &PTR__ReferenceChecker_00172758;
          local_368._8_8_ = local_338 + 8;
          local_358._M_allocated_capacity = 1;
          local_358._8_8_ = (long *)0x0;
          _Stack_348._M_nxt = (_Hash_node_base *)0x0;
          local_340._M_pi._0_4_ = 0x3f800000;
          local_338._0_8_ = (shared_ptr<peg::Ope> *)0x0;
          local_338._8_8_ = 0;
          local_328._0_8_ = &_Stack_2f8;
          local_328._8_8_ = 1;
          local_328._16_8_ = (_Hash_node_base *)0x0;
          local_328._24_8_ = 0;
          local_308.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               CONCAT44(local_308.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                        _4_4_,0x3f800000);
          local_308.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          _Stack_2f8._M_nxt = (_Hash_node_base *)0x0;
          local_2f0._M_buckets = &local_2f0._M_single_bucket;
          local_2f0._M_bucket_count = 1;
          local_2f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_2f0._M_element_count = 0;
          local_2f0._M_rehash_policy._M_max_load_factor = 1.0;
          local_2f0._M_rehash_policy._M_next_resize = 0;
          local_2f0._M_single_bucket = (__node_base_ptr)0x0;
          local_2b8 = local_370;
          local_378 = psVar19;
          (**(code **)(**(long **)(psVar19 + 0x1e8) + 0x18))(*(long **)(psVar19 + 0x1e8),local_368);
          _Var39._M_p = (pointer)local_2a8;
          for (_Var23._M_nxt = local_2f0._M_before_begin._M_nxt;
              _Var23._M_nxt != (_Hash_node_base *)0x0; _Var23._M_nxt = (_Var23._M_nxt)->_M_nxt) {
            std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_2a8,_Var23._M_nxt + 1,(string *)&stack0xfffffffffffffc58);
          }
          uVar32 = local_358._8_8_;
          if ((long *)local_358._8_8_ != (long *)0x0) {
            do {
              if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope
                  != (_func_int **)0x0) {
                p_Var12 = *(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            **)(uVar32 + 0x28);
                plVar29 = (long *)0x1;
                p_Var27 = (_Hash_node_base *)0x1;
                p_Var24 = local_388;
                p_Var16 = local_388;
                if (local_388 <= p_Var12 && (long)p_Var12 - (long)local_388 != 0) {
                  uVar14 = 1;
                  do {
                    bVar37 = *(char *)&p_Var16->_M_buckets == '\n';
                    p_Var16 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)((long)&p_Var16->_M_buckets + 1);
                    if (bVar37) {
                      p_Var24 = p_Var16;
                    }
                    uVar14 = uVar14 + bVar37;
                  } while (p_Var16 != p_Var12);
                  p_Var16 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)(((long)p_Var12 - (long)local_388) + (long)local_388);
                  p_Var27 = (_Hash_node_base *)(ulong)uVar14;
                }
                uVar15 = (long)p_Var16 - (long)p_Var24;
                if (uVar15 != 0) {
                  plVar29 = (long *)0x1;
                  uVar17 = 0;
                  do {
                    bVar1 = *(byte *)((long)&p_Var24->_M_buckets + uVar17);
                    lVar31 = 1;
                    if ((((char)bVar1 < '\0') &&
                        ((uVar25 = uVar15 - uVar17, uVar25 == 1 ||
                         (lVar31 = 2, (bVar1 & 0xe0) != 0xc0)))) &&
                       ((uVar25 < 3 || (lVar31 = 3, (bVar1 & 0xf0) != 0xe0)))) {
                      lVar31 = 0;
                      if (3 < uVar25) {
                        lVar31 = (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
                      }
                    }
                    uVar17 = uVar17 + lVar31;
                    plVar29 = (long *)((long)plVar29 + 1);
                  } while (uVar17 < uVar15);
                }
                pmVar10 = std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)local_328,(key_type *)(uVar32 + 8));
                _Var39._M_p = (pointer)&local_398;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&stack0xfffffffffffffc58,"","");
                local_270[0] = plVar29;
                local_250._M_dataplus._M_p = (pointer)p_Var27;
                if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope
                    == (_func_int **)0x0) {
                  std::__throw_bad_function_call();
                }
                (*(code *)ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3].
                          _vptr_Ope)
                          (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           &local_250,local_270,pmVar10,(string *)&stack0xfffffffffffffc58);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var39._M_p != &local_398) {
                  operator_delete(_Var39._M_p,local_398._M_allocated_capacity + 1);
                }
              }
              uVar32 = *(undefined8 *)uVar32;
            } while (uVar32 != 0);
            uVar35 = 0;
          }
          uVar34 = (undefined4)uVar35;
          local_368._0_8_ = &PTR__ReferenceChecker_00172758;
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_2f0);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_328);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)(local_368 + 8));
          psVar19 = *(string **)local_378;
        } while (psVar19 != (string *)0x0);
      }
      local_378 = (string *)CONCAT44(local_378._4_4_,uVar34);
      p_Var27 = (local_370->_M_before_begin)._M_nxt;
      p_Var12 = local_388;
      if (p_Var27 != (_Hash_node_base *)0x0) {
        do {
          cVar11 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)local_2a8,(key_type *)(p_Var27 + 1));
          if ((cVar11.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur == (__node_type *)0x0) &&
             (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope !=
              (_func_int **)0x0)) {
            p_Var24 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)p_Var27[9]._M_nxt;
            plVar29 = (long *)0x1;
            p_Var28 = (_Hash_node_base *)0x1;
            lVar31 = (long)p_Var24 - (long)p_Var12;
            p_Var16 = p_Var12;
            if (p_Var12 <= p_Var24 && lVar31 != 0) {
              uVar14 = 1;
              p_Var12 = local_388;
              p_Var16 = local_388;
              do {
                bVar37 = *(char *)&p_Var16->_M_buckets == '\n';
                p_Var16 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)((long)&p_Var16->_M_buckets + 1);
                if (bVar37) {
                  p_Var12 = p_Var16;
                }
                uVar14 = uVar14 + bVar37;
              } while (p_Var16 != p_Var24);
              p_Var16 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)(lVar31 + (long)local_388);
              p_Var28 = (_Hash_node_base *)(ulong)uVar14;
            }
            uVar15 = (long)p_Var16 - (long)p_Var12;
            if (uVar15 != 0) {
              plVar29 = (long *)0x1;
              uVar17 = 0;
              do {
                bVar1 = *(byte *)((long)&p_Var12->_M_buckets + uVar17);
                lVar31 = 1;
                if ((((char)bVar1 < '\0') &&
                    ((uVar25 = uVar15 - uVar17, uVar25 == 1 || (lVar31 = 2, (bVar1 & 0xe0) != 0xc0))
                    )) && ((uVar25 < 3 || (lVar31 = 3, (bVar1 & 0xf0) != 0xe0)))) {
                  lVar31 = 0;
                  if (3 < uVar25) {
                    lVar31 = (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
                  }
                }
                uVar17 = uVar17 + lVar31;
                plVar29 = (long *)((long)plVar29 + 1);
              } while (uVar17 < uVar15);
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xfffffffffffffc58,"\'",(key_type *)(p_Var27 + 1));
            plVar9 = (long *)std::__cxx11::string::append((char *)&stack0xfffffffffffffc58);
            local_368._0_8_ = &local_358;
            paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 == paVar30) {
              local_358._M_allocated_capacity = paVar30->_M_allocated_capacity;
              local_358._8_8_ = plVar9[3];
            }
            else {
              local_358._M_allocated_capacity = paVar30->_M_allocated_capacity;
              local_368._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar9;
            }
            local_368._8_8_ = plVar9[1];
            *plVar9 = (long)paVar30;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var39._M_p != &local_398) {
              operator_delete(_Var39._M_p,local_398._M_allocated_capacity + 1);
            }
            _Var39._M_p = (pointer)&local_398;
            std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc58,"");
            local_270[0] = plVar29;
            local_250._M_dataplus._M_p = (pointer)p_Var28;
            if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope ==
                (_func_int **)0x0) {
              std::__throw_bad_function_call();
            }
            (*(code *)ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3].
                      _vptr_Ope)
                      (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       &local_250,local_270,local_368,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffc58);
            p_Var12 = local_388;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var39._M_p != &local_398) {
              operator_delete(_Var39._M_p,local_398._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
            }
          }
          p_Var27 = p_Var27->_M_nxt;
        } while (p_Var27 != (_Hash_node_base *)0x0);
      }
      p_Var24 = local_370;
      if (((ulong)local_378 & 1) == 0) {
LAB_001167dc:
        ((_Hashtable *)&(local_380->_M_h)._M_buckets)->_M_buckets = (__buckets_ptr)0x0;
        (local_380->_M_h)._M_bucket_count = 0;
      }
      else {
        p_Var27 = (local_370->_M_before_begin)._M_nxt;
        if (p_Var27 != (_Hash_node_base *)0x0) {
          do {
            local_358._M_allocated_capacity = (size_type)(p_Var27 + 0x23);
            local_368._0_8_ = &PTR__Visitor_00172848;
            local_368._8_8_ = p_Var24;
            (*(code *)(p_Var27[0x3d]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var27[0x3d]._M_nxt,local_368);
            p_Var27 = p_Var27->_M_nxt;
          } while (p_Var27 != (_Hash_node_base *)0x0);
        }
        p_Var27 = (p_Var24->_M_before_begin)._M_nxt;
        if (p_Var27 != (_Hash_node_base *)0x0) {
          bVar37 = true;
          do {
            local_368._0_8_ = &PTR__DetectLeftRecursion_00172488;
            local_368._8_8_ =
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)0x0;
            local_358._M_allocated_capacity = (size_type)&_Stack_348;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_358,p_Var27[1]._M_nxt,
                       (long)&(p_Var27[1]._M_nxt)->_M_nxt + (long)&(p_Var27[2]._M_nxt)->_M_nxt);
            local_338._0_8_ = &local_308;
            local_338._8_8_ = 1;
            local_328._0_8_ = (__node_base *)0x0;
            local_328._8_8_ = 0;
            local_328._16_4_ = 0x3f800000;
            local_328._24_8_ = 0;
            local_308.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_308.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 local_308.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi & 0xffffffffffffff00;
            (*(code *)(p_Var27[0x3d]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var27[0x3d]._M_nxt,local_368);
            if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_368._8_8_ !=
                (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)0x0) {
              if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope
                  != (_func_int **)0x0) {
                lVar33 = 1;
                uVar15 = 1;
                lVar31 = local_368._8_8_ - (long)p_Var12;
                p_Var24 = p_Var12;
                if (p_Var12 <= (ulong)local_368._8_8_ && lVar31 != 0) {
                  uVar14 = 1;
                  p_Var12 = local_388;
                  p_Var24 = local_388;
                  do {
                    bVar37 = *(char *)&p_Var24->_M_buckets == '\n';
                    p_Var24 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)((long)&p_Var24->_M_buckets + 1);
                    if (bVar37) {
                      p_Var12 = p_Var24;
                    }
                    uVar14 = uVar14 + bVar37;
                  } while (p_Var24 !=
                           (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)local_368._8_8_);
                  p_Var24 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)(lVar31 + (long)local_388);
                  uVar15 = (ulong)uVar14;
                }
                uVar17 = (long)p_Var24 - (long)p_Var12;
                if (uVar17 != 0) {
                  lVar33 = 1;
                  uVar25 = 0;
                  do {
                    bVar1 = *(byte *)((long)&p_Var12->_M_buckets + uVar25);
                    lVar31 = 1;
                    if ((((char)bVar1 < '\0') &&
                        ((uVar26 = uVar17 - uVar25, uVar26 == 1 ||
                         (lVar31 = 2, (bVar1 & 0xe0) != 0xc0)))) &&
                       ((uVar26 < 3 || (lVar31 = 3, (bVar1 & 0xf0) != 0xe0)))) {
                      lVar31 = 0;
                      if (3 < uVar26) {
                        lVar31 = (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
                      }
                    }
                    uVar25 = uVar25 + lVar31;
                    lVar33 = lVar33 + 1;
                  } while (uVar25 < uVar17);
                }
                std::operator+(&local_250,"\'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (p_Var27 + 1));
                plVar29 = (long *)std::__cxx11::string::append((char *)&local_250);
                _Var39._M_p = (pointer)&local_398;
                paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar29 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar29 == paVar30) {
                  local_398._M_allocated_capacity = paVar30->_M_allocated_capacity;
                  local_398._8_4_ = (undefined4)plVar29[3];
                  local_398._12_4_ = *(undefined4 *)((long)plVar29 + 0x1c);
                }
                else {
                  local_398._M_allocated_capacity = paVar30->_M_allocated_capacity;
                  _Var39._M_p = (pointer)*plVar29;
                }
                *plVar29 = (long)paVar30;
                plVar29[1] = 0;
                *(undefined1 *)(plVar29 + 2) = 0;
                local_270[0] = local_260;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"");
                local_208 = lVar33;
                local_200 = uVar15;
                if (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2]._vptr_Ope
                    == (_func_int **)0x0) {
                  std::__throw_bad_function_call();
                }
                (*(code *)ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3].
                          _vptr_Ope)
                          (ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           &local_200,&local_208,&stack0xfffffffffffffc58,local_270);
                p_Var12 = local_388;
                if (local_270[0] != local_260) {
                  operator_delete(local_270[0],local_260[0] + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var39._M_p != &local_398) {
                  operator_delete(_Var39._M_p,local_398._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_250._M_dataplus._M_p != &local_250.field_2) {
                  operator_delete(local_250._M_dataplus._M_p,
                                  local_250.field_2._M_allocated_capacity + 1);
                }
              }
              bVar37 = false;
            }
            local_368._0_8_ = &PTR__DetectLeftRecursion_00172488;
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)local_338);
            if ((_Hash_node_base *)local_358._M_allocated_capacity != &_Stack_348) {
              operator_delete((void *)local_358._M_allocated_capacity,
                              (ulong)((long)&(_Stack_348._M_nxt)->_M_nxt + 1));
            }
            p_Var27 = p_Var27->_M_nxt;
          } while (p_Var27 != (_Hash_node_base *)0x0);
          p_Var24 = local_370;
          if (!bVar37) goto LAB_001167dc;
        }
        bVar37 = detect_infiniteLoop((ParserGenerator *)local_228,(Data *)local_130,local_230,
                                     (Log *)ope.
                                            super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr,(char *)p_Var12);
        if (bVar37) goto LAB_001167dc;
        local_368._0_8_ = &local_358;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"%whitespace","");
        cVar13 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(p_Var24,(key_type *)local_368);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._0_8_ != &local_358) {
          operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
        }
        if (cVar13.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_true>
            ._M_cur != (__node_type *)0x0) {
          p_Var27 = (p_Var24->_M_before_begin)._M_nxt;
          if (p_Var27 != (_Hash_node_base *)0x0) {
            do {
              p_Var28 = p_Var27[0x3d]._M_nxt[1]._M_nxt;
              _Var20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             p_Var27[0x3d]._M_nxt[2]._M_nxt;
              if (_Var20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (_Var20._M_pi)->_M_use_count = (_Var20._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (_Var20._M_pi)->_M_use_count = (_Var20._M_pi)->_M_use_count + 1;
                }
              }
              local_368._0_8_ = &PTR__Visitor_00172c60;
              local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
              (*(code *)p_Var28->_M_nxt[3]._M_nxt)(p_Var28,local_368);
              if (local_368[8] == _S_black) {
                local_368._0_8_ = (_Hash_node_base *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<peg::TokenBoundary,std::allocator<peg::TokenBoundary>,std::shared_ptr<peg::Ope>const&>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_368 + 8),
                           (TokenBoundary **)local_368,(allocator<peg::TokenBoundary> *)local_270,
                           (shared_ptr<peg::Ope> *)&stack0xfffffffffffffc58);
                local_250._M_dataplus._M_p = (pointer)local_368._0_8_;
                local_250._M_string_length = local_368._8_8_;
                p_Var28 = p_Var27[0x3d]._M_nxt;
                p_Var28[1]._M_nxt = (_Hash_node_base *)local_368._0_8_;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var28 + 2),
                           (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_250._M_string_length
                          );
                if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_250._M_string_length !=
                    (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_250._M_string_length);
                }
              }
              if (_Var20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var20._M_pi);
              }
              p_Var27 = p_Var27->_M_nxt;
            } while (p_Var27 != (_Hash_node_base *)0x0);
          }
          local_368._0_8_ = &local_358;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"%whitespace","");
          p_Var24 = local_370;
          pmVar8 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_370,(key_type *)local_368);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._0_8_ != &local_358) {
            operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
          }
          p_Var12 = local_388;
          _Var20._M_pi = (((pmVar8->holder_).
                           super___shared_ptr<peg::Holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ope_
                         ).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi;
          if (_Var20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Var20._M_pi)->_M_use_count = (_Var20._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Var20._M_pi)->_M_use_count = (_Var20._M_pi)->_M_use_count + 1;
            }
          }
          wsp((peg *)local_368,(shared_ptr<peg::Ope> *)&stack0xfffffffffffffc58);
          uVar32 = local_368._8_8_;
          uVar35 = local_368._0_8_;
          local_368._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_368._8_8_ =
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)0x0;
          p_Var4 = (local_230->whitespaceOpe).
                   super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          (local_230->whitespaceOpe).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)uVar35;
          (local_230->whitespaceOpe).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
          if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)local_368._8_8_ !=
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
          }
          if (_Var20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var20._M_pi);
          }
          bVar37 = detect_infiniteLoop((ParserGenerator *)local_228,(Data *)local_130,pmVar8,
                                       (Log *)ope.
                                              super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr,(char *)p_Var12);
          if (bVar37) goto LAB_001167dc;
        }
        local_368._0_8_ = &local_358;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"%word","");
        cVar13 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(p_Var24,(key_type *)local_368);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._0_8_ != &local_358) {
          operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
        }
        if (cVar13.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_true>
            ._M_cur != (__node_type *)0x0) {
          local_368._0_8_ = &local_358;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"%word","");
          pmVar8 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)p_Var24,(key_type *)local_368);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._0_8_ != &local_358) {
            operator_delete((void *)local_368._0_8_,(ulong)(local_358._M_allocated_capacity + 1));
          }
          peVar2 = (pmVar8->holder_).super___shared_ptr<peg::Holder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          peVar5 = (peVar2->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var4 = (peVar2->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          (local_230->wordOpe).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar5;
          this_00 = (local_230->wordOpe).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (local_230->wordOpe).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = p_Var4;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          bVar37 = detect_infiniteLoop((ParserGenerator *)local_228,(Data *)local_130,pmVar8,
                                       (Log *)ope.
                                              super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr,(char *)p_Var12);
          if (bVar37) goto LAB_001167dc;
        }
        if (local_b0 != (mapped_type *)(local_130 + 0x70)) {
          pmVar8 = local_b0;
          do {
            rule = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)p_Var24,(key_type *)&pmVar8->s_);
            p_Var36 = *(_Manager_type *)
                       ((long)&(pmVar8->predicate).super__Function_base._M_functor + 8);
            p_Var6 = (pmVar8->predicate).super__Function_base._M_manager;
            local_230 = pmVar8;
            if (p_Var36 != p_Var6) {
              local_378 = (string *)&rule->error_message;
              do {
                iVar7 = std::__cxx11::string::compare((char *)p_Var36);
                if (iVar7 == 0) {
                  __x = (_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                         *)std::
                           __any_caster<std::map<std::basic_string_view<char,std::char_traits<char>>,std::pair<unsigned_long,char>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,char>>>>>
                                     ((any *)(p_Var36 + 0x20));
                  if (__x == (_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                              *)0x0) {
                    std::__throw_bad_any_cast();
                  }
                  std::
                  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                  ::_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                              *)local_368,__x);
                  std::
                  function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::function((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&local_150,
                             (function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ;
                  bVar37 = apply_precedence_instruction
                                     ((ParserGenerator *)local_228,rule,(BinOpeInfo *)local_368,
                                      (char *)local_388,(Log *)&local_150);
                  if (local_140 != (code *)0x0) {
                    (*local_140)(&local_150,&local_150,__destroy_functor);
                  }
                  if (!bVar37) {
                    ((_Hashtable *)&(local_380->_M_h)._M_buckets)->_M_buckets = (__buckets_ptr)0x0;
                    (local_380->_M_h)._M_bucket_count = 0;
                    std::
                    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                    ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                                 *)local_368);
                    goto LAB_001167e7;
                  }
                  std::
                  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                               *)local_368);
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)p_Var36);
                  if (iVar7 == 0) {
                    plVar29 = (long *)std::__any_caster<std::__cxx11::string>
                                                ((any *)(p_Var36 + 0x20));
                    if (plVar29 == (long *)0x0) {
                      std::__throw_bad_any_cast();
                    }
                    local_368._0_8_ = &local_358;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_368,*plVar29,plVar29[1] + *plVar29);
                    std::__cxx11::string::operator=(local_378,(string *)local_368);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_368._0_8_ != &local_358) {
                      operator_delete((void *)local_368._0_8_,
                                      (ulong)(local_358._M_allocated_capacity + 1));
                    }
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare((char *)p_Var36);
                    if (iVar7 == 0) {
                      rule->no_ast_opt = true;
                    }
                  }
                }
                p_Var36 = p_Var36 + 0x40;
              } while (p_Var36 != p_Var6);
            }
            pmVar8 = (mapped_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_230);
            p_Var24 = local_370;
          } while (pmVar8 != (mapped_type *)(local_130 + 0x70));
        }
        std::__cxx11::string::_M_assign(local_210);
        (log->super__Function_base)._M_functor._M_pod_data[0] = local_38;
        ((_Hashtable *)&(local_380->_M_h)._M_buckets)->_M_buckets = (__buckets_ptr)local_130._0_8_;
        (local_380->_M_h)._M_bucket_count = local_130._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_130._8_8_ + 8) = *(_Atomic_word *)(local_130._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_130._8_8_ + 8) = *(_Atomic_word *)(local_130._8_8_ + 8) + 1;
          }
        }
      }
LAB_001167e7:
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_2a8);
      goto LAB_001167f4;
    }
  }
  ((_Hashtable *)&(local_380->_M_h)._M_buckets)->_M_buckets = (__buckets_ptr)0x0;
  (local_380->_M_h)._M_bucket_count = 0;
LAB_001167f4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.error_info.label._M_dataplus._M_p != &local_1d8.error_info.label.field_2) {
    operator_delete(local_1d8.error_info.label._M_dataplus._M_p,
                    local_1d8.error_info.label.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.error_info.message._M_dataplus._M_p != &local_1d8.error_info.message.field_2) {
    operator_delete(local_1d8.error_info.message._M_dataplus._M_p,
                    local_1d8.error_info.message.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8.error_info.expected_tokens.
      super__Vector_base<std::pair<const_char_*,_const_peg::Definition_*>,_std::allocator<std::pair<const_char_*,_const_peg::Definition_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.error_info.expected_tokens.
                    super__Vector_base<std::pair<const_char_*,_const_peg::Definition_*>,_std::allocator<std::pair<const_char_*,_const_peg::Definition_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.error_info.expected_tokens.
                          super__Vector_base<std::pair<const_char_*,_const_peg::Definition_*>,_std::allocator<std::pair<const_char_*,_const_peg::Definition_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.error_info.expected_tokens.
                          super__Vector_base<std::pair<const_char_*,_const_peg::Definition_*>,_std::allocator<std::pair<const_char_*,_const_peg::Definition_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_220._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_220._M_manager)(_Op_destroy,&local_220,(_Arg *)0x0);
    local_220._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Rb_tree(&local_68);
  std::
  vector<std::set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  ::~vector(&local_80);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::~vector(&local_98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>_>_>
               *)(local_130 + 0x68));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
             *)(local_130 + 0x50));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
             *)(local_130 + 0x38));
  _Var20._M_pi = extraout_RDX;
  if ((undefined1 *)local_130._16_8_ != local_130 + 0x20) {
    operator_delete((void *)local_130._16_8_,local_130._32_8_ + 1);
    _Var20._M_pi = extraout_RDX_00;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
    _Var20._M_pi = extraout_RDX_01;
  }
  sVar38.
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var20._M_pi;
  sVar38.
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_380;
  return (shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
          )sVar38.
           super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Grammar> perform_core(const char *s, size_t n,
                                        const Rules &rules, std::string &start,
                                        bool &enablePackratParsing, Log log) {
    Data data;
    auto &grammar = *data.grammar;

    // Built-in macros
    {
      // `%recover`
      {
        auto &rule = grammar[RECOVER_DEFINITION_NAME];
        rule <= ref(grammar, "x", "", false, {});
        rule.name = RECOVER_DEFINITION_NAME;
        rule.s_ = "[native]";
        rule.ignoreSemanticValue = true;
        rule.is_macro = true;
        rule.params = {"x"};
      }
    }

    std::any dt = &data;
    auto r = g["Grammar"].parse(s, n, dt, nullptr, log);

    if (!r.ret) {
      if (log) {
        if (r.error_info.message_pos) {
          auto line = line_info(s, r.error_info.message_pos);
          log(line.first, line.second, r.error_info.message,
              r.error_info.label);
        } else {
          auto line = line_info(s, r.error_info.error_pos);
          log(line.first, line.second, "syntax error", r.error_info.label);
        }
      }
      return nullptr;
    }

    // User provided rules
    for (auto [user_name, user_rule] : rules) {
      auto name = user_name;
      auto ignore = false;
      if (!name.empty() && name[0] == '~') {
        ignore = true;
        name.erase(0, 1);
      }
      if (!name.empty()) {
        auto &rule = grammar[name];
        rule <= user_rule;
        rule.name = name;
        rule.ignoreSemanticValue = ignore;
      }
    }

    // Check duplicated definitions
    auto ret = true;

    if (!data.duplicates_of_definition.empty()) {
      for (const auto &[name, ptr] : data.duplicates_of_definition) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second,
              "The definition '" + name + "' is already defined.", "");
        }
      }
      ret = false;
    }

    // Check duplicated instructions
    if (!data.duplicates_of_instruction.empty()) {
      for (const auto &[type, ptr] : data.duplicates_of_instruction) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second,
              "The instruction '" + type + "' is already defined.", "");
        }
      }
      ret = false;
    }

    // Check undefined back references
    if (!data.undefined_back_references.empty()) {
      for (const auto &[name, ptr] : data.undefined_back_references) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second,
              "The back reference '" + name + "' is undefined.", "");
        }
      }
      ret = false;
    }

    // Set root definition
    auto &start_rule = grammar[data.start];

    // Check if the start rule has ignore operator
    {
      if (start_rule.ignoreSemanticValue) {
        if (log) {
          auto line = line_info(s, start_rule.s_);
          log(line.first, line.second,
              "Ignore operator cannot be applied to '" + start_rule.name + "'.",
              "");
        }
        ret = false;
      }
    }

    if (!ret) { return nullptr; }

    // Check missing definitions
    auto referenced = std::unordered_set<std::string>{
        WHITESPACE_DEFINITION_NAME,
        WORD_DEFINITION_NAME,
        RECOVER_DEFINITION_NAME,
        start_rule.name,
    };

    for (auto &[_, rule] : grammar) {
      ReferenceChecker vis(grammar, rule.params);
      rule.accept(vis);
      referenced.insert(vis.referenced.begin(), vis.referenced.end());
      for (const auto &[name, ptr] : vis.error_s) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second, vis.error_message[name], "");
        }
        ret = false;
      }
    }

    for (auto &[name, rule] : grammar) {
      if (!referenced.count(name)) {
        if (log) {
          auto line = line_info(s, rule.s_);
          auto msg = "'" + name + "' is not referenced.";
          log(line.first, line.second, msg, "");
        }
      }
    }

    if (!ret) { return nullptr; }

    // Link references
    for (auto &x : grammar) {
      auto &rule = x.second;
      LinkReferences vis(grammar, rule.params);
      rule.accept(vis);
    }

    // Check left recursion
    ret = true;

    for (auto &[name, rule] : grammar) {
      DetectLeftRecursion vis(name);
      rule.accept(vis);
      if (vis.error_s) {
        if (log) {
          auto line = line_info(s, vis.error_s);
          log(line.first, line.second, "'" + name + "' is left recursive.", "");
        }
        ret = false;
      }
    }

    if (!ret) { return nullptr; }

    // Check infinite loop
    if (detect_infiniteLoop(data, start_rule, log, s)) { return nullptr; }

    // Automatic whitespace skipping
    if (grammar.count(WHITESPACE_DEFINITION_NAME)) {
      for (auto &x : grammar) {
        auto &rule = x.second;
        auto ope = rule.get_core_operator();
        if (IsLiteralToken::check(*ope)) { rule <= tok(ope); }
      }

      auto &rule = grammar[WHITESPACE_DEFINITION_NAME];
      start_rule.whitespaceOpe = wsp(rule.get_core_operator());

      if (detect_infiniteLoop(data, rule, log, s)) { return nullptr; }
    }

    // Word expression
    if (grammar.count(WORD_DEFINITION_NAME)) {
      auto &rule = grammar[WORD_DEFINITION_NAME];
      start_rule.wordOpe = rule.get_core_operator();

      if (detect_infiniteLoop(data, rule, log, s)) { return nullptr; }
    }

    // Apply instructions
    for (const auto &[name, instructions] : data.instructions) {
      auto &rule = grammar[name];

      for (const auto &instruction : instructions) {
        if (instruction.type == "precedence") {
          const auto &info =
              std::any_cast<PrecedenceClimbing::BinOpeInfo>(instruction.data);

          if (!apply_precedence_instruction(rule, info, s, log)) {
            return nullptr;
          }
        } else if (instruction.type == "error_message") {
          rule.error_message = std::any_cast<std::string>(instruction.data);
        } else if (instruction.type == "no_ast_opt") {
          rule.no_ast_opt = true;
        }
      }
    }

    // Set root definition
    start = data.start;
    enablePackratParsing = data.enablePackratParsing;

    return data.grammar;
  }